

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.hpp
# Opt level: O0

void __thiscall Gmres::gmres(Gmres *this,double *x,double *b_vec)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  double *in_RDX;
  double *in_RSI;
  uchar *sig;
  double *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  double dVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  int16_t j;
  int16_t i_2;
  uint16_t i_1;
  uint16_t i;
  double buf;
  uint16_t idx_g;
  uint16_t idx_h;
  uint16_t idx_v2;
  uint16_t idx_v1;
  uint16_t k;
  double in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffc8;
  ushort uVar6;
  ushort in_stack_ffffffffffffffcc;
  ushort in_stack_ffffffffffffffce;
  double *in_stack_ffffffffffffffd0;
  ushort local_1a;
  
  (**(code **)*in_RDI)(in_RDI,in_RDI[3],in_RSI);
  sub((double *)in_RDI[3],in_RDX,(double *)in_RDI[3],*(int16_t *)(in_RDI + 1));
  dVar4 = norm(in_RDI,(int16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
  *(double *)in_RDI[5] = dVar4;
  if (in_RDI[2] <= *(double *)in_RDI[5]) {
    div(SUB84(in_RDI[3],0),SUB84(in_RDI[3],0));
    for (local_1a = 0; uVar6 = local_1a, local_1a < *(ushort *)((long)in_RDI + 10);
        local_1a = local_1a + 1) {
      (**(code **)*in_RDI)
                (in_RDI,(long)in_RDI[3] +
                        (long)(int)((uint)*(ushort *)(in_RDI + 1) * (local_1a + 1)) * 8,
                 (long)in_RDI[3] + (long)(int)((uint)*(ushort *)(in_RDI + 1) * (uint)local_1a) * 8);
      uVar1 = *(short *)(in_RDI + 1) * (local_1a + 1);
      for (in_stack_ffffffffffffffce = 0; (uint)in_stack_ffffffffffffffce < local_1a + 1;
          in_stack_ffffffffffffffce = in_stack_ffffffffffffffce + 1) {
        uVar3 = *(short *)(in_RDI + 1) * in_stack_ffffffffffffffce;
        uVar2 = (*(short *)((long)in_RDI + 10) + 1) * local_1a + in_stack_ffffffffffffffce;
        dVar4 = dot((double *)((long)in_RDI[3] + (ulong)uVar3 * 8),
                    (double *)((long)in_RDI[3] + (ulong)uVar1 * 8),*(int16_t *)(in_RDI + 1));
        *(double *)((long)in_RDI[4] + (ulong)uVar2 * 8) = dVar4;
        mul((double *)in_RDI[7],(double *)((long)in_RDI[3] + (ulong)uVar3 * 8),
            *(double *)((long)in_RDI[4] + (ulong)uVar2 * 8),*(int16_t *)(in_RDI + 1));
        sub((double *)((long)in_RDI[3] + (ulong)uVar1 * 8),
            (double *)((long)in_RDI[3] + (ulong)uVar1 * 8),(double *)in_RDI[7],
            *(int16_t *)(in_RDI + 1));
      }
      uVar3 = (*(short *)((long)in_RDI + 10) + 1) * local_1a + local_1a + 1;
      dVar4 = norm(in_RDI,(int16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
      *(double *)((long)in_RDI[4] + (ulong)uVar3 * 8) = dVar4;
      if (ABS(*(double *)((long)in_RDI[4] + (ulong)uVar3 * 8)) < 2.220446049250313e-16) {
        printf("Breakdown\n");
        return;
      }
      ctx = (EVP_PKEY_CTX *)((long)in_RDI[3] + (ulong)uVar1 * 8);
      sig = (uchar *)((long)in_RDI[3] + (ulong)uVar1 * 8);
      div((int)ctx,(int)sig);
      for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffcc < local_1a;
          in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
        uVar3 = (*(short *)((long)in_RDI + 10) + 1) * local_1a + in_stack_ffffffffffffffcc;
        uVar1 = in_stack_ffffffffffffffcc * 3;
        dVar4 = (*(double *)((long)in_RDI[6] + (long)(int)(uint)uVar1 * 8) *
                 *(double *)((long)in_RDI[4] + (long)(int)(uint)uVar3 * 8) +
                *(double *)((long)in_RDI[6] + (long)(int)(uVar1 + 1) * 8) *
                *(double *)((long)in_RDI[4] + (long)(int)(uVar3 + 1) * 8)) *
                *(double *)((long)in_RDI[6] + (long)(int)(uVar1 + 2) * 8);
        *(double *)((long)in_RDI[4] + (long)(int)(uint)uVar3 * 8) =
             -dVar4 * *(double *)((long)in_RDI[6] + (long)(int)(uint)uVar1 * 8) +
             *(double *)((long)in_RDI[4] + (long)(int)(uint)uVar3 * 8);
        *(double *)((long)in_RDI[4] + (long)(int)(uVar3 + 1) * 8) =
             -dVar4 * *(double *)((long)in_RDI[6] + (long)(int)(uVar1 + 1) * 8) +
             *(double *)((long)in_RDI[4] + (long)(int)(uVar3 + 1) * 8);
      }
      uVar3 = (*(short *)((long)in_RDI + 10) + 1) * local_1a + local_1a;
      uVar1 = local_1a * 3;
      sign(ctx,sig,(size_t *)(ulong)local_1a,(uchar *)(ulong)uVar3,in_R8);
      in_stack_ffffffffffffffb8 = -extraout_XMM0_Qa;
      dVar4 = norm(in_RDI,(int16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
      dVar4 = in_stack_ffffffffffffffb8 * dVar4;
      *(double *)((long)in_RDI[6] + (long)(int)(uint)uVar1 * 8) =
           *(double *)((long)in_RDI[4] + (long)(int)(uint)uVar3 * 8) - dVar4;
      *(undefined8 *)((long)in_RDI[6] + (long)(int)(uVar1 + 1) * 8) =
           *(undefined8 *)((long)in_RDI[4] + (long)(int)(uVar3 + 1) * 8);
      dVar5 = dot((double *)((long)in_RDI[6] + (ulong)uVar1 * 8),
                  (double *)((long)in_RDI[6] + (ulong)uVar1 * 8),2);
      *(double *)((long)in_RDI[6] + (long)(int)(uVar1 + 2) * 8) = 2.0 / dVar5;
      *(double *)((long)in_RDI[4] + (long)(int)(uint)uVar3 * 8) = dVar4;
      *(undefined8 *)((long)in_RDI[4] + (long)(int)(uVar3 + 1) * 8) = 0;
      in_stack_ffffffffffffffd0 =
           (double *)
           (*(double *)((long)in_RDI[6] + (long)(int)(uint)uVar1 * 8) *
            *(double *)((long)in_RDI[5] + (long)(int)(uint)local_1a * 8) *
           *(double *)((long)in_RDI[6] + (long)(int)(uVar1 + 2) * 8));
      *(double *)((long)in_RDI[5] + (long)(int)(uint)local_1a * 8) =
           -(double)in_stack_ffffffffffffffd0 *
           *(double *)((long)in_RDI[6] + (long)(int)(uint)uVar1 * 8) +
           *(double *)((long)in_RDI[5] + (long)(int)(uint)local_1a * 8);
      *(double *)((long)in_RDI[5] + (long)(int)(local_1a + 1) * 8) =
           -(double)in_stack_ffffffffffffffd0 *
           *(double *)((long)in_RDI[6] + (long)(int)(uVar1 + 1) * 8);
      if (ABS(*(double *)((long)in_RDI[5] + (long)(int)(local_1a + 1) * 8)) < in_RDI[2]) break;
    }
    while (uVar6 = uVar6 - 1, uVar1 = local_1a, -1 < (short)uVar6) {
      while (in_stack_ffffffffffffffc8 = uVar1 - 1, (short)uVar6 < (short)in_stack_ffffffffffffffc8)
      {
        *(double *)((long)in_RDI[5] + (long)(short)uVar6 * 8) =
             -*(double *)
               ((long)in_RDI[4] +
               (ulong)(ushort)((*(short *)((long)in_RDI + 10) + 1) * in_stack_ffffffffffffffc8 +
                              uVar6) * 8) *
             *(double *)((long)in_RDI[5] + (long)(short)in_stack_ffffffffffffffc8 * 8) +
             *(double *)((long)in_RDI[5] + (long)(short)uVar6 * 8);
        uVar1 = in_stack_ffffffffffffffc8;
      }
      *(double *)((long)in_RDI[5] + (long)(short)uVar6 * 8) =
           *(double *)((long)in_RDI[5] + (long)(short)uVar6 * 8) /
           *(double *)
            ((long)in_RDI[4] +
            (ulong)(ushort)((*(short *)((long)in_RDI + 10) + 1) * uVar6 + uVar6) * 8);
    }
    mul(in_stack_ffffffffffffffd0,
        (double *)
        CONCAT26(in_stack_ffffffffffffffce,
                 CONCAT24(in_stack_ffffffffffffffcc,CONCAT22(uVar6,in_stack_ffffffffffffffc8))),
        in_RDI,(int16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
        (int16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    add(in_RSI,in_RSI,
        (double *)
        ((long)in_RDI[3] +
        (long)(int)((uint)*(ushort *)(in_RDI + 1) * (uint)*(ushort *)((long)in_RDI + 10)) * 8),
        *(int16_t *)(in_RDI + 1));
  }
  return;
}

Assistant:

void gmres(double *x, const double *b_vec) {
    uint16_t k, idx_v1, idx_v2, idx_h, idx_g;
    double buf;

    // r0 = b - Ax(x0)
    Ax_func(&v_mat[0], x);
    sub(&v_mat[0], b_vec, &v_mat[0], len);

    // rho = sqrt(r0' * r0)
    rho_e_vec[0] = norm(&v_mat[0], len);

    if (rho_e_vec[0] < tol) {
      return;
    }

    // v(0) = r0 / rho
    div(&v_mat[0], &v_mat[0], rho_e_vec[0], len);

    for (k = 0; k < k_max; k++) {
      // v(k + 1) = Ax(v(k))
      Ax_func(&v_mat[len * (k + 1)], &v_mat[len * k]);

      idx_v1 = len * (k + 1);
      // Modified Gram-Schmidt
      for (uint16_t i = 0; i < k + 1; i++) {
        idx_v2 = len * i;
        idx_h = (k_max + 1) * k + i;
        h_mat[idx_h] = dot(&v_mat[idx_v2], &v_mat[idx_v1], len);
        mul(U_buf, &v_mat[idx_v2], h_mat[idx_h], len);
        sub(&v_mat[idx_v1], &v_mat[idx_v1], U_buf, len);
      }
      idx_h = (k_max + 1) * k + (k + 1);
      h_mat[idx_h] = norm(&v_mat[idx_v1], len);

      // Check breakdown
      if (fabs(h_mat[idx_h]) < DBL_EPSILON) {
        printf("Breakdown\n");
        return;
      } else {
        div(&v_mat[idx_v1], &v_mat[idx_v1], h_mat[idx_h], len);
      }

      // Transformation h_mat to upper triangular matrix by Householder transformation
      for (uint16_t i = 0; i < k; i++) {
        idx_h = (k_max + 1) * k + i;
        idx_g = g_vec_len * i;
        buf = (g_vec[idx_g + 0] * h_mat[idx_h + 0] + g_vec[idx_g + 1] * h_mat[idx_h + 1]) * g_vec[idx_g + 2];
        h_mat[idx_h + 0] = h_mat[idx_h + 0] - buf * g_vec[idx_g + 0];
        h_mat[idx_h + 1] = h_mat[idx_h + 1] - buf * g_vec[idx_g + 1];
      }
      idx_h = (k_max + 1) * k + k;
      idx_g = g_vec_len * k;
      buf = -sign(h_mat[idx_h]) * norm(&h_mat[idx_h], 2);  // Vector length
      g_vec[idx_g + 0] = h_mat[idx_h + 0] - buf;
      g_vec[idx_g + 1] = h_mat[idx_h + 1];
      g_vec[idx_g + 2] = 2.0 / dot(&g_vec[idx_g], &g_vec[idx_g], 2);
      h_mat[idx_h + 0] = buf;
      h_mat[idx_h + 1] = 0.0;

      // Update residual
      buf = g_vec[idx_g + 0] * rho_e_vec[k + 0] * g_vec[idx_g + 2];
      rho_e_vec[k + 0] = rho_e_vec[k + 0] - buf * g_vec[idx_g + 0];
      rho_e_vec[k + 1] = -buf * g_vec[idx_g + 1];

      // Check convergence
      if (fabs(rho_e_vec[k + 1]) < tol) {
        break;
      }
    }

    // Solve h_mat * y = rho_e_vec
    // h_mat is upper triangle matrix
    for (int16_t i = k - 1; i >= 0; i--) {
      for (int16_t j = k - 1; j > i; j--) {
        idx_h = (k_max + 1) * j + i;
        rho_e_vec[i] -= h_mat[idx_h] * rho_e_vec[j];
      }
      idx_h = (k_max + 1) * i + i;
      rho_e_vec[i] /= h_mat[idx_h];
    }

    // x = x + v_mat * y
    mul(&v_mat[len * k_max], v_mat, rho_e_vec, len, k);
    add(x, x, &v_mat[len * k_max], len);
  }